

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::StrPair::Set(StrPair *this,char *start,char *end,int flags)

{
  Reset(this);
  this->_start = start;
  this->_end = end;
  this->_flags = flags | 0x100;
  return;
}

Assistant:

void Set( char* start, char* end, int flags ) {
        TIXMLASSERT( start );
        TIXMLASSERT( end );
        Reset();
        _start  = start;
        _end    = end;
        _flags  = flags | NEEDS_FLUSH;
    }